

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall StackLattice_GetBottom_Test::TestBody(StackLattice_GetBottom_Test *this)

{
  Stack<wasm::analysis::Flat<unsigned_int>_> *this_00;
  bool bVar1;
  char *message;
  AssertHelper local_70;
  Message local_68 [3];
  uint local_4c;
  Element local_48;
  size_type local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  Stack<wasm::analysis::Flat<unsigned_int>_> stack;
  StackLattice_GetBottom_Test *this_local;
  
  this_00 = (Stack<wasm::analysis::Flat<unsigned_int>_> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  ::wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>_>::Stack
            (this_00,(Flat<unsigned_int> *)
                     ((long)&gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 6));
  ::wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>_>::getBottom(&local_48,this_00);
  local_30 = std::
             vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
             ::size(&local_48);
  local_4c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_28,"stack.getBottom().size()","0u",&local_30,&local_4c);
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::~vector(&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x2c0,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

TEST(StackLattice, GetBottom) {
  analysis::Stack stack{analysis::Flat<uint32_t>{}};
  EXPECT_EQ(stack.getBottom().size(), 0u);
}